

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O0

void __thiscall
bwtil::cw_bwt::cw_bwt(cw_bwt *this,string *input_string,cw_bwt_input_type input_type,bool verbose)

{
  int iVar1;
  uint uVar2;
  BackwardIterator *pBVar3;
  undefined4 extraout_var;
  byte in_CL;
  int in_EDX;
  EVP_PKEY_CTX *ctx;
  cw_bwt *in_RDI;
  ContextAutomata *this_00;
  ContextAutomata *in_stack_fffffffffffffec8;
  ContextAutomata *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  BackwardStringIterator *in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff38;
  ContextAutomata *in_stack_ffffffffffffff40;
  
  ContextAutomata::ContextAutomata(in_stack_fffffffffffffed0);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::vector
            ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)0x138c5a);
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
            *)0x138c70);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x138c86);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x138c9c);
  in_RDI->verbose = (bool)(in_CL & 1);
  if (in_EDX == 0) {
    pBVar3 = (BackwardIterator *)operator_new(0x60);
    BackwardFileIterator::BackwardFileIterator
              ((BackwardFileIterator *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    in_RDI->bwIt = pBVar3;
  }
  else {
    pBVar3 = (BackwardIterator *)operator_new(0x30);
    BackwardStringIterator::BackwardStringIterator
              (in_stack_fffffffffffffef0,
               (string *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    in_RDI->bwIt = pBVar3;
  }
  iVar1 = (*in_RDI->bwIt->_vptr_BackwardIterator[6])();
  in_RDI->n = CONCAT44(extraout_var,iVar1);
  ContextAutomata::ContextAutomata
            (in_stack_ffffffffffffff40,(BackwardIterator *)in_stack_ffffffffffffff38,
             (uint)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  this_00 = &in_RDI->ca;
  ctx = (EVP_PKEY_CTX *)&stack0xffffffffffffff38;
  ContextAutomata::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  ContextAutomata::~ContextAutomata(in_stack_fffffffffffffed0);
  uVar2 = ContextAutomata::contextLength(this_00);
  in_RDI->k = uVar2;
  init(in_RDI,ctx);
  if (in_RDI->bwIt != (BackwardIterator *)0x0) {
    (*in_RDI->bwIt->_vptr_BackwardIterator[1])();
  }
  return;
}

Assistant:

cw_bwt(string &input_string, cw_bwt_input_type input_type, bool verbose=false){

		this->verbose=verbose;

		if(input_type==path)
			bwIt = new BackwardFileIterator(input_string);
		else
			bwIt = new BackwardStringIterator(input_string);

		n = bwIt->length();

		ca = ContextAutomata(bwIt, 10, verbose);//Default automata overhead
		k = ca.contextLength();

		init();

		delete bwIt;

	}